

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O1

int DataManager::getLinkIndex(char *name,int *index,Network *nw)

{
  int iVar1;
  string local_48;
  allocator local_21;
  
  std::__cxx11::string::string((string *)&local_48,name,&local_21);
  iVar1 = Network::indexOf(nw,LINK,&local_48);
  *index = iVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return *index >> 0x1f & 0xcd;
}

Assistant:

int DataManager::getLinkIndex(char* name, int* index, Network* nw)
{
    *index = nw->indexOf(Element::LINK, name);
    if ( *index < 0 ) return 205;
    return 0;
}